

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O2

int __thiscall llvm::StringMapImpl::init(StringMapImpl *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  ulong uVar3;
  
  uVar1 = (uint)ctx;
  if ((uVar1 & uVar1 - 1) == 0) {
    uVar3 = 0x10;
    if (uVar1 != 0) {
      uVar3 = (ulong)ctx & 0xffffffff;
    }
    this->NumItems = 0;
    this->NumTombstones = 0;
    ppSVar2 = (StringMapEntryBase **)safe_calloc((ulong)((uint)uVar3 + 1),0xc);
    this->TheTable = ppSVar2;
    this->NumBuckets = (uint)uVar3;
    ppSVar2[uVar3] = (StringMapEntryBase *)0x2;
    return (int)ppSVar2;
  }
  __assert_fail("(InitSize & (InitSize-1)) == 0 && \"Init Size must be a power of 2 or zero!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/StringMap.cpp"
                ,0x36,"void llvm::StringMapImpl::init(unsigned int)");
}

Assistant:

void StringMapImpl::init(unsigned InitSize) {
  assert((InitSize & (InitSize-1)) == 0 &&
         "Init Size must be a power of 2 or zero!");

  unsigned NewNumBuckets = InitSize ? InitSize : 16;
  NumItems = 0;
  NumTombstones = 0;

  TheTable = static_cast<StringMapEntryBase **>(
      safe_calloc(NewNumBuckets+1,
                  sizeof(StringMapEntryBase **) + sizeof(unsigned)));

  // Set the member only if TheTable was successfully allocated
  NumBuckets = NewNumBuckets;

  // Allocate one extra bucket, set it to look filled so the iterators stop at
  // end.
  TheTable[NumBuckets] = (StringMapEntryBase*)2;
}